

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_stuff.cpp
# Opt level: O2

bool CheatCheckList(event_t *ev,cheatseq_t *cheats,int numcheats)

{
  BYTE BVar1;
  byte bVar2;
  bool bVar3;
  BYTE *pBVar4;
  uint uVar5;
  
  uVar5 = 0;
  if (ev->type == '\x01') {
    if (numcheats < 1) {
      numcheats = uVar5;
    }
    while (numcheats != 0) {
      BVar1 = (BYTE)ev->data2;
      pBVar4 = cheats->Pos;
      if (pBVar4 == (BYTE *)0x0) {
        pBVar4 = cheats->Sequence;
        cheats->Pos = pBVar4;
        cheats->CurrentArg = '\0';
      }
      if (*pBVar4 == '\0') {
        bVar2 = cheats->CurrentArg;
        cheats->CurrentArg = bVar2 + 1;
        cheats->Args[bVar2] = BVar1;
        pBVar4 = pBVar4 + 1;
        cheats->Pos = pBVar4;
        uVar5 = 1;
      }
      else if (*pBVar4 == BVar1) {
        pBVar4 = pBVar4 + 1;
        cheats->Pos = pBVar4;
      }
      else {
        pBVar4 = cheats->Sequence;
        cheats->Pos = pBVar4;
        cheats->CurrentArg = '\0';
      }
      if (*pBVar4 == 0xff) {
        cheats->Pos = cheats->Sequence;
        cheats->CurrentArg = '\0';
        if ((cheats->DontCheck != '\0') || (bVar3 = CheckCheatmode(true), !bVar3)) {
          bVar3 = (*cheats->Handler)(cheats);
          goto LAB_0048152c;
        }
      }
      else {
        bVar3 = 2 < (long)pBVar4 - (long)cheats->Sequence;
LAB_0048152c:
        uVar5 = (uint)(byte)((byte)uVar5 | bVar3);
      }
      cheats = cheats + 1;
      numcheats = numcheats - 1;
    }
  }
  return SUB41(uVar5,0);
}

Assistant:

static bool CheatCheckList (event_t *ev, cheatseq_t *cheats, int numcheats)
{
	bool eat = false;

	if (ev->type == EV_KeyDown)
	{
		int i;

		for (i = 0; i < numcheats; i++, cheats++)
		{
			if (CheatAddKey (cheats, (BYTE)ev->data2, &eat))
			{
				if (cheats->DontCheck || !CheckCheatmode ())
				{
					eat |= cheats->Handler (cheats);
				}
			}
			else if (cheats->Pos - cheats->Sequence > 2)
			{ // If more than two characters into the sequence,
			  // eat the keypress, just so that the Hexen cheats
			  // with T in them will work without unbinding T.
				eat = true;
			}
		}
	}
	return eat;
}